

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

bool __thiscall QItemSelectionModel::isSelected(QItemSelectionModel *this,QModelIndex *index)

{
  bool bVar1;
  QItemSelectionModelPrivate *pQVar2;
  parameter_type pQVar3;
  QAbstractItemModel *pQVar4;
  const_iterator __first;
  const_iterator __last;
  anon_class_8_1_a81517f2_for__M_pred __pred;
  qsizetype qVar5;
  arrow_operator_result ppQVar6;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  bool selected;
  QItemSelectionModelPrivate *d;
  anon_class_1_0_00000001 contains;
  QFlagsStorage<Qt::ItemFlag> in_stack_ffffffffffffff8c;
  undefined5 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff95;
  byte in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  bool local_39;
  bool local_19;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_18;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_14;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_10;
  __0 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QItemSelectionModel *)0x82d37a);
  pQVar3 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                       *)0x82d38d);
  pQVar4 = QModelIndex::model((QModelIndex *)0x82d39c);
  if ((pQVar3 == pQVar4) &&
     (bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT15(in_stack_ffffffffffffff95,
                                                    in_stack_ffffffffffffff90)))), bVar1)) {
    local_9 = (__0)0xaa;
    __first = QList<QItemSelectionRange>::begin
                        ((QList<QItemSelectionRange> *)
                         CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT15(in_stack_ffffffffffffff95,
                                                    in_stack_ffffffffffffff90))));
    __last = QList<QItemSelectionRange>::end
                       ((QList<QItemSelectionRange> *)
                        CONCAT17(in_stack_ffffffffffffff97,
                                 CONCAT16(in_stack_ffffffffffffff96,
                                          CONCAT15(in_stack_ffffffffffffff95,
                                                   in_stack_ffffffffffffff90))));
    __pred = const::$_0::operator()(&local_9,in_RSI);
    local_39 = std::operator()(__first,__last,__pred);
    qVar5 = QList<QItemSelectionRange>::size
                      (&(pQVar2->currentSelection).super_QList<QItemSelectionRange>);
    if (qVar5 != 0) {
      local_10.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)
                      CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,
                                        CONCAT15(in_stack_ffffffffffffff95,in_stack_ffffffffffffff90
                                                ))),in_stack_ffffffffffffff8c.i);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
      in_stack_ffffffffffffff97 = local_39;
      if (!bVar1) {
        in_stack_ffffffffffffff97 = false;
      }
      if ((bool)in_stack_ffffffffffffff97 == false) {
        local_14.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             QFlags<QItemSelectionModel::SelectionFlag>::operator&
                       ((QFlags<QItemSelectionModel::SelectionFlag> *)
                        (ulong)CONCAT16(in_stack_ffffffffffffff96,
                                        CONCAT15(in_stack_ffffffffffffff95,in_stack_ffffffffffffff90
                                                )),in_stack_ffffffffffffff8c.i);
        bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
        if (bVar1) {
          bVar1 = QItemSelection::contains((QItemSelection *)__first.i,(QModelIndex *)__last.i);
          local_39 = local_39 != bVar1;
        }
        else {
          local_18.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
               (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
               QFlags<QItemSelectionModel::SelectionFlag>::operator&
                         ((QFlags<QItemSelectionModel::SelectionFlag> *)
                          CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(in_stack_ffffffffffffff96,
                                            CONCAT15(in_stack_ffffffffffffff95,
                                                     in_stack_ffffffffffffff90))),
                          in_stack_ffffffffffffff8c.i);
          bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
          in_stack_ffffffffffffff96 = 0;
          if (bVar1) {
            in_stack_ffffffffffffff96 = local_39 ^ 0xff;
          }
          if ((in_stack_ffffffffffffff96 & 1) != 0) {
            local_39 = QItemSelection::contains((QItemSelection *)__first.i,(QModelIndex *)__last.i)
            ;
          }
        }
      }
      else {
        bVar1 = QItemSelection::contains((QItemSelection *)__first.i,(QModelIndex *)__last.i);
        local_39 = (bool)((bVar1 ^ 0xffU) & 1);
      }
    }
    if (local_39 == false) {
      local_19 = false;
    }
    else {
      ppQVar6 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                              *)CONCAT17(in_stack_ffffffffffffff97,
                                         CONCAT16(in_stack_ffffffffffffff96,
                                                  CONCAT15(in_stack_ffffffffffffff95,
                                                           in_stack_ffffffffffffff90))));
      (*((*ppQVar6)->super_QObject)._vptr_QObject[0x27])(*ppQVar6,in_RSI);
      local_19 = isSelectableAndEnabled((ItemFlags)in_stack_ffffffffffffff8c.i);
    }
  }
  else {
    local_19 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool QItemSelectionModel::isSelected(const QModelIndex &index) const
{
    Q_D(const QItemSelectionModel);
    if (d->model != index.model() || !index.isValid())
        return false;

    //  search model ranges
    auto contains = [](const auto &index) {
        return [&index](const auto &range) { return range.contains(index); };
    };
    bool selected = std::any_of(d->ranges.begin(), d->ranges.end(), contains(index));

    // check  currentSelection
    if (d->currentSelection.size()) {
        if ((d->currentCommand & Deselect) && selected)
            selected = !d->currentSelection.contains(index);
        else if (d->currentCommand & Toggle)
            selected ^= d->currentSelection.contains(index);
        else if ((d->currentCommand & Select) && !selected)
            selected = d->currentSelection.contains(index);
    }

    if (selected)
        return isSelectableAndEnabled(d->model->flags(index));

    return false;
}